

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int64_t msa_dotp_s_df(uint32_t df,int64_t arg1,int64_t arg2)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  
  uVar3 = 1L << ((char)df + 3U & 0x3f);
  bVar1 = -(char)(uVar3 >> 1);
  bVar2 = -(char)uVar3;
  return ((arg2 << (bVar1 & 0x3f)) >> (bVar1 & 0x3f)) * ((arg1 << (bVar1 & 0x3f)) >> (bVar1 & 0x3f))
         + ((arg2 << (bVar2 & 0x3f)) >> (bVar1 & 0x3f)) *
           ((arg1 << (bVar2 & 0x3f)) >> (bVar1 & 0x3f));
}

Assistant:

static inline int64_t msa_dotp_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int64_t even_arg1;
    int64_t even_arg2;
    int64_t odd_arg1;
    int64_t odd_arg2;
    SIGNED_EXTRACT(even_arg1, odd_arg1, arg1, df);
    SIGNED_EXTRACT(even_arg2, odd_arg2, arg2, df);
    return (even_arg1 * even_arg2) + (odd_arg1 * odd_arg2);
}